

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::HDF5OutputParameter::ByteSizeLong(HDF5OutputParameter *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    sVar2 = ((this->file_name_).ptr_)->_M_string_length;
    uVar5 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t HDF5OutputParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.HDF5OutputParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // optional string file_name = 1;
  if (has_file_name()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->file_name());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}